

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

bool __thiscall
PruneReplayer::filter_timestamp(PruneReplayer *this,ResourceTag tag,Hash hash,uint64_t *ts)

{
  bool bVar1;
  uint uVar2;
  pointer pDVar3;
  long local_48;
  size_t timestamp_size;
  ulong uStack_38;
  bool ret;
  uint64_t timestamp;
  uint64_t *ts_local;
  Hash hash_local;
  PruneReplayer *pPStack_18;
  ResourceTag tag_local;
  PruneReplayer *this_local;
  
  timestamp = (uint64_t)ts;
  ts_local = (uint64_t *)hash;
  hash_local._4_4_ = tag;
  pPStack_18 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->timestamp_db);
  if (bVar1) {
    uStack_38 = 0;
    timestamp_size._7_1_ = 1;
    local_48 = 8;
    pDVar3 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->timestamp_db);
    uVar2 = (*pDVar3->_vptr_DatabaseInterface[3])
                      (pDVar3,(ulong)hash_local._4_4_,ts_local,&local_48,&stack0xffffffffffffffc8,0)
    ;
    if (((uVar2 & 1) == 0) || (local_48 != 8)) {
      timestamp_size._7_1_ = 0;
    }
    if (uStack_38 < this->timestamp_minimum_accept) {
      timestamp_size._7_1_ = 0;
    }
    if (timestamp != 0) {
      *(ulong *)timestamp = uStack_38;
    }
    this_local._7_1_ = (bool)(timestamp_size._7_1_ & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool filter_timestamp(ResourceTag tag, Hash hash, uint64_t *ts) const
	{
		if (!timestamp_db)
			return true;

		uint64_t timestamp = 0;
		bool ret = true;

		size_t timestamp_size = sizeof(timestamp);
		if (!timestamp_db->read_entry(tag, hash, &timestamp_size, &timestamp, PAYLOAD_READ_NO_FLAGS) ||
		    timestamp_size != sizeof(timestamp))
		{
			ret = false;
		}

		if (timestamp < timestamp_minimum_accept)
			ret = false;

		if (ts)
			*ts = timestamp;

		return ret;
	}